

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  double dVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  ChebyshevExpansion *this_00;
  Index i;
  long index;
  VectorXd new_mc;
  VectorXcd eigs;
  double x;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this;
  reduce_zeros((ChebyshevExpansion *)&new_mc,&this->m_c);
  if (1 < new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    if (new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 2)
    {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&new_mc,0);
      dVar1 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&new_mc,1);
      if ((!only_in_domain) || (ABS(-dVar1 / *pSVar2) <= 1.0)) {
        x = ((this->m_xmax - this->m_xmin) * (-dVar1 / *pSVar2) + this->m_xmax + this->m_xmin) * 0.5
        ;
        std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&x);
      }
    }
    else {
      companion_matrix((MatrixXd *)&x,this_00,&new_mc);
      eigenvalues((ChebTools *)&eigs,(MatrixXd *)&x,true);
      free((void *)x);
      for (index = 0;
          index < eigs.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows; index = index + 1) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>,_1>::
                 operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>,_1>
                             *)&eigs,index);
        dVar1 = *(double *)(pSVar3->_M_value + 8);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>,_1>::
                 operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>,_1>
                             *)&eigs,index);
        if (ABS(dVar1 / *(double *)pSVar3->_M_value) < 1e-15) {
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>,_1>::
                   operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>,_1>
                               *)&eigs,index);
          if (ABS(*(double *)pSVar3->_M_value) <= 1.0 || !only_in_domain) {
            x = ((this->m_xmax - this->m_xmin) * *(double *)pSVar3->_M_value +
                this->m_xmax + this->m_xmin) * 0.5;
            std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&x);
          }
        }
      }
      free(eigs.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
    }
  }
  free(new_mc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots(bool only_in_domain) const {
      //vector of roots to be returned
        std::vector<double> roots;
        Eigen::VectorXd new_mc = reduce_zeros(m_c);
        //if the Chebyshev polynomial is just a constant, then there are no roots
        //if a_0=0 then there are infinite roots, but for our purposes, infinite roots doesnt make sense
        if (new_mc.size()<=1){ //we choose <=1 to account for the case of no coefficients
          return roots; //roots is empty
        }

        //if the Chebyshev polynomial is linear, then the only possible root is -a_0/a_1
        //we have this else if block because eigen is not a fan of 1x1 matrices
        else if (new_mc.size()==2){
          double val_n11 = -new_mc(0)/new_mc(1);
          const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
          // Keep it if it is in domain, or if you just want all real roots
          if (!only_in_domain || is_in_domain) {
              // Rescale back into real-world values in [xmin,xmax] from [-1,1]
              double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
              roots.push_back(x);
          }
        }

        //this for all cases of higher order polynomials
        else{
          // The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
          // decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
          // in the domain [-1, 1], but it might also include values outside [-1, 1]
          Eigen::VectorXcd eigs = eigenvalues(companion_matrix(new_mc), /* balance = */ true);


          for (Eigen::Index i = 0; i < eigs.size(); ++i) {
              if (std::abs(eigs(i).imag() / eigs(i).real()) < 1e-15) {
                  double val_n11 = eigs(i).real();
                  const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
                  // Keep it if it is in domain, or if you just want all real roots
                  if (!only_in_domain || is_in_domain) {
                      // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                      double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
                      roots.push_back(x);
                  }
              }
          }
        }
        return roots;
    
    //// The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
    //// decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
    //// in the domain [-1, 1], but it might also include values outside [-1, 1]
    //Eigen::VectorXd real_eigs = eigenvalues_upperHessenberg(companion_matrix().transpose(), /* balance = */ true);
    //
    //std::vector<double> roots;
    //for (Eigen::Index i = 0; i < real_eigs.size(); ++i){
    //    double val_n11 = real_eigs(i);
    //    const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
    //    // Keep it if it is in domain, or if you just want all real roots
    //    if (!only_in_domain || is_in_domain){
    //        // Rescale back into real-world values in [xmin,xmax] from [-1,1]
    //        double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
    //        roots.push_back(x);
    //    }
    //}
    //return roots;
    }